

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_4fColor __thiscall ON_XMLVariant::AsColor(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  ON_4fColor OVar2;
  ON_4fColor col;
  ON_4fColor local_28;
  ON_Color local_14;
  
  ON_Color::ON_Color(&local_14,0,0,0,0);
  ON_4fColor::ON_4fColor(&local_28,&local_14);
  pOVar1 = this->_private;
  if (1 < pOVar1->_type - DoubleArray4) {
    if (pOVar1->_type != String) {
      OVar2.m_color[0] = local_28.m_color[0];
      OVar2.m_color[1] = local_28.m_color[1];
      OVar2.m_color[2] = local_28.m_color[2];
      OVar2.m_color[3] = local_28.m_color[3];
      return (ON_4fColor)OVar2.m_color;
    }
    (*this->_vptr_ON_XMLVariant[0x31])(this,4);
    pOVar1 = this->_private;
  }
  ON_4fColor::SetRGBA(&local_28,(float)(pOVar1->field_2)._double_val,
                      (float)(pOVar1->field_2).m_xform.m_xform[0][1],
                      (float)(pOVar1->field_2).m_xform.m_xform[0][2],
                      (float)(pOVar1->field_2).m_xform.m_xform[0][3]);
  return (ON_4fColor)local_28.m_color;
}

Assistant:

ON_4fColor ON_XMLVariant::AsColor(void) const
{
  ON_4fColor col(ON_Color(0, 0, 0, 0));

  switch (_private->_type)
  {
  case Types::String:
    StringToPoint(4);
    // No break...
  case Types::DoubleArray4:
  case Types::DoubleColor4:
    col.SetRGBA(float(_private->_array_val[0]), float(_private->_array_val[1]), float(_private->_array_val[2]), float(_private->_array_val[3]));
  
  default:
    break;
  }

  return col;
}